

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSAtom JS_DupAtom(JSContext *ctx,JSAtom v)

{
  int *piVar1;
  BOOL BVar2;
  JSAtom in_ESI;
  long in_RDI;
  JSAtomStruct *p;
  JSRuntime *rt;
  
  BVar2 = __JS_AtomIsConst(in_ESI);
  if (BVar2 == 0) {
    piVar1 = *(int **)(*(long *)(*(long *)(in_RDI + 0x18) + 0x60) + (ulong)in_ESI * 8);
    *piVar1 = *piVar1 + 1;
  }
  return in_ESI;
}

Assistant:

JSAtom JS_DupAtom(JSContext *ctx, JSAtom v)
{
    JSRuntime *rt;
    JSAtomStruct *p;

    if (!__JS_AtomIsConst(v)) {
        rt = ctx->rt;
        p = rt->atom_array[v];
        p->header.ref_count++;
    }
    return v;
}